

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void getDirectoryPart(char *fullpath,uint length,uint *newLength)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  
  if (newLength != (uint *)0x0) {
    uVar1 = 0;
    if (length != 0 && fullpath != (char *)0x0) {
      pcVar3 = fullpath + length;
      uVar1 = length - 1;
      do {
        uVar2 = uVar1;
        pcVar3 = pcVar3 + -1;
        if ((pcVar3 <= fullpath) || (*pcVar3 == '\\')) break;
        uVar1 = uVar2 - 1;
      } while (*pcVar3 != '/');
      uVar1 = length;
      if (fullpath < pcVar3) {
        uVar1 = uVar2;
      }
    }
    *newLength = uVar1;
  }
  return;
}

Assistant:

void getDirectoryPart(const char * fullpath, unsigned int length, unsigned int * newLength)
{
    if (newLength == 0x0)
    {
        return;
    }

    if (fullpath == 0x0 || length == 0)
    {
        *newLength = 0;
        return;
    }

    const char * iter = fullpath + length - 1;
    while (iter > fullpath && *iter != unixPathDelim && *iter != windowsPathDelim)
    {
        --iter;
    }

    *newLength = iter > fullpath ? (unsigned int)(iter - fullpath) : length;
}